

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet6_address.cpp
# Opt level: O3

void __thiscall
sockpp::inet6_address::inet6_address(inet6_address *this,in6_addr *addr,in_port_t port)

{
  undefined8 uVar1;
  
  (this->super_sock_address)._vptr_sock_address = (_func_int **)&PTR__sock_address_0010bb38;
  (this->addr_).sin6_family = 0;
  (this->addr_).sin6_port = 0;
  (this->addr_).sin6_flowinfo = 0;
  *(undefined8 *)&(this->addr_).sin6_addr.__in6_u = 0;
  *(undefined8 *)((long)&(this->addr_).sin6_addr.__in6_u + 4) = 0;
  *(undefined8 *)((long)&(this->addr_).sin6_addr.__in6_u + 0xc) = 0;
  (this->addr_).sin6_family = 10;
  uVar1 = *(undefined8 *)((long)&addr->__in6_u + 8);
  *(undefined8 *)&(this->addr_).sin6_addr.__in6_u = *(undefined8 *)&addr->__in6_u;
  *(undefined8 *)((long)&(this->addr_).sin6_addr.__in6_u + 8) = uVar1;
  (this->addr_).sin6_port = port << 8 | port >> 8;
  return;
}

Assistant:

inet6_address::inet6_address(const in6_addr& addr, in_port_t port) {
    addr_.sin6_family = AF_INET6;
    addr_.sin6_addr = addr;
    addr_.sin6_port = htons(port);
#if defined(__APPLE__) || defined(BSD)
    addr_.sin6_len = (uint8_t)SZ;
#endif
}